

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

optional<unsigned_long> __thiscall
tsbp::LeftmostActiveOnly::Branch(LeftmostActiveOnly *this,size_t nodeId)

{
  type_conflict tVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  unsigned_long v;
  vertex_bundled *pvVar5;
  reference piVar6;
  allocator<unsigned_long> *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar8;
  reference rVar9;
  optional<unsigned_long> oVar10;
  bool local_24a;
  _Storage<unsigned_long,_true> local_208;
  _Storage<unsigned_long,_true> local_200;
  pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> local_1f8;
  undefined1 local_1d8 [24];
  vertices_size_type local_1c0;
  vertex_descriptor leftNodeId_1;
  block_type local_1b0;
  int local_1a4;
  iterator iStack_1a0;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Node *targetNode;
  vertex_descriptor targetId;
  tuples local_160 [16];
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>_>
  local_150;
  allocator<unsigned_long> local_129;
  undefined1 local_128 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  edge_descriptor outEdge;
  undefined1 local_e8 [8];
  out_edge_iterator outEdgeEndIterator;
  out_edge_iterator outEdgeIterator;
  undefined1 local_98 [24];
  vertices_size_type local_80;
  vertex_descriptor leftNodeId;
  int local_70;
  int local_6c;
  int placementY;
  int placementX;
  Packing2D *packing;
  undefined1 local_58;
  size_t local_50;
  size_t numberOfRemainingItems;
  size_t numberOfOutgoingEdges;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *placedItems;
  Node *currentNode;
  size_t nodeId_local;
  LeftmostActiveOnly *this_local;
  optional<unsigned_long> newNodeId;
  
  currentNode = (Node *)nodeId;
  nodeId_local = (size_t)this;
  placedItems = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                boost::
                adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>
                ::operator[](&this->tree,nodeId);
  local_38 = Node::PlacedItems((Node *)placedItems);
  if (*(int *)&(placedItems->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish == 6) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar7 = extraout_RDX;
  }
  else {
    numberOfRemainingItems =
         boost::
         out_degree<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                   ((vertex_descriptor)currentNode,
                    (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                     *)&this->tree);
    sVar3 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
    sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(local_38);
    local_50 = sVar3 - sVar4;
    if (numberOfRemainingItems == local_50) {
      pVar8 = std::
              unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
              ::emplace<unsigned_long&>
                        ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                          *)&this->nodesToDeactivate,(unsigned_long *)&currentNode);
      packing = (Packing2D *)pVar8.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_58 = pVar8.second;
      _placementY = std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::
                    operator*((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)
                              &(placedItems->m_bits).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_6c = _placementY->ActiveX;
      local_70 = _placementY->ActiveY;
      if (*(int *)&(placedItems->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish == 1) {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        uVar7 = extraout_RDX_00;
      }
      else if ((local_70 == 0) && (local_6c == _placementY->MaxX)) {
        *(undefined4 *)
         &(placedItems->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = 6;
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        uVar7 = extraout_RDX_01;
      }
      else {
        local_80 = boost::
                   num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                             ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                               *)&this->tree);
        local_98._0_4_ = -1;
        local_98._4_4_ = DeactivatePlacement;
        local_98._8_4_ = NotEvaluated;
        std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator*
                  ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)
                   &(placedItems->m_bits).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::make_unique<tsbp::Packing2D,tsbp::Packing2D&>((Packing2D *)(local_98 + 0x10));
        AddLeafNode(this,(Node *)local_98);
        Node::~Node((Node *)local_98);
        boost::
        add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                   &outEdgeIterator.m_src,(boost *)currentNode,local_80,
                   (vertex_descriptor)&this->tree,in_R8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->activeNodes,&local_80);
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)&this_local,&local_80);
        uVar7 = extraout_RDX_02;
      }
    }
    else {
      boost::detail::
      out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
      ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                       *)&outEdgeEndIterator.m_src);
      boost::detail::
      out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
      ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                       *)local_e8);
      boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>::edge_desc_impl
                ((edge_desc_impl<boost::directed_tag,_unsigned_long> *)&attemptedItemIds.m_num_bits)
      ;
      sVar3 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size
                        (&this->items);
      this_00 = &local_129;
      CLI::std::allocator<unsigned_long>::allocator(this_00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,sVar3,0,
                 this_00);
      CLI::std::allocator<unsigned_long>::~allocator(&local_129);
      boost::
      out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_150,(boost *)currentNode,(vertex_descriptor)&this->tree,
                 (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                  *)this_00);
      boost::tuples::
      tie<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>>
                (local_160,
                 (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                  *)&outEdgeEndIterator.m_src,
                 (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                  *)local_e8);
      boost::tuples::
      tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
      ::operator=((tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                   *)local_160,&local_150);
      while (tVar1 = boost::iterators::operator!=
                               ((iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                                 *)&outEdgeEndIterator.m_src,
                                (iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                                 *)local_e8), tVar1) {
        boost::iterators::detail::
        iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
        ::operator*((reference *)&targetId,
                    (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
                     *)&outEdgeEndIterator.m_src);
        attemptedItemIds.m_num_bits = targetId;
        v = boost::
            target<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>
                      ((edge_base<boost::directed_tag,_unsigned_long> *)&attemptedItemIds.m_num_bits
                       ,&this->tree);
        pvVar5 = boost::
                 adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>
                 ::operator[](&this->tree,v);
        if (-1 < (pvVar5->super_BaseNode).ItemIdToPlace) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                     (long)(pvVar5->super_BaseNode).ItemIdToPlace,true);
        }
        boost::iterators::detail::
        iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
                      *)&outEdgeEndIterator.m_src);
      }
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
      __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->branchingOrder);
      iStack_1a0 = std::vector<int,_std::allocator<int>_>::end(&this->branchingOrder);
      while (bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                               (&__end1,&stack0xfffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end1);
        local_1a4 = *piVar6;
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_38,(long)local_1a4);
        local_24a = true;
        if (!bVar2) {
          rVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             local_128,(long)local_1a4);
          local_1b0 = rVar9.m_mask;
          leftNodeId_1 = (vertex_descriptor)rVar9.m_block;
          local_24a = boost::dynamic_bitset::reference::operator_cast_to_bool
                                ((reference *)&leftNodeId_1);
        }
        if (local_24a == false) {
          local_1c0 = boost::
                      num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                                ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                                  *)&this->tree);
          local_1d8._0_4_ = local_1a4;
          local_1d8._4_4_ = UsePlacement;
          local_1d8._8_4_ = NotEvaluated;
          std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator*
                    ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)
                     &(placedItems->m_bits).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::make_unique<tsbp::Packing2D,tsbp::Packing2D&>((Packing2D *)(local_1d8 + 0x10));
          AddLeafNode(this,(Node *)local_1d8);
          Node::~Node((Node *)local_1d8);
          boost::
          add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                    (&local_1f8,(boost *)currentNode,local_1c0,(vertex_descriptor)&this->tree,in_R8)
          ;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&this->activeNodes,&local_1c0);
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)&local_208,&local_1c0);
          this_local = (LeftmostActiveOnly *)local_208;
          newNodeId.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload = local_200;
          break;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end1);
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
      uVar7 = extraout_RDX_03;
    }
  }
  oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar7 >> 8);
  oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       (bool)newNodeId.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
  oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> LeftmostActiveOnly::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = items.size() - placedItems.count();

    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.

        this->nodesToDeactivate.emplace(nodeId);

        const Packing2D& packing = *currentNode.Packing;

        int placementX = packing.ActiveX;
        int placementY = packing.ActiveY;

        if (currentNode.NodeStatus == Node::Status::Root)
        {
            return std::nullopt;
        }

        if (placementY == 0 && placementX == packing.MaxX)
        {
            currentNode.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return std::nullopt;
        }

        /*
        typename SearchTree::in_edge_iterator inEdgeIterator;
        typename SearchTree::in_edge_iterator inEdgeEndIterator;
        typename SearchTree::edge_descriptor inEdge;

        for (boost::tie(inEdgeIterator, inEdgeEndIterator) = boost::in_edges(this->tree, nodeId); inEdgeIterator != inEdgeEndIterator; ++inEdgeIterator)
        {
            inEdge = *inEdgeIterator;
            typename SearchTree::vertex_descriptor targetId = boost::source(inEdge, this->tree);
            const Node& targetNode = this->tree[targetId];
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}